

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O1

void cuddCacheResize(DdManager *table)

{
  undefined8 *puVar1;
  uint uVar2;
  DdCache *__ptr;
  DdCache *pDVar3;
  DdNode *pDVar4;
  double dVar5;
  uint uVar6;
  _func_void_long *p_Var7;
  DdCache *pDVar8;
  int iVar9;
  DdCache *pDVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  double dVar15;
  
  __ptr = table->acache;
  pDVar3 = table->cache;
  uVar2 = table->cacheSlots;
  uVar6 = uVar2 * 2;
  table->cacheSlots = uVar6;
  p_Var7 = Extra_UtilMMoutOfMemory;
  Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
  pDVar8 = (DdCache *)malloc((ulong)(uVar2 * 2 + 2) * 0x28);
  table->acache = pDVar8;
  Extra_UtilMMoutOfMemory = p_Var7;
  if (pDVar8 == (DdCache *)0x0) {
    table->cacheSlots = uVar2;
    table->acache = __ptr;
    table->maxCacheHard = uVar2 - 1;
    table->cacheSlack = ~uVar2;
  }
  else {
    uVar11 = 0x20 - ((uint)pDVar8 & 0x1f);
    pDVar10 = (DdCache *)((long)&pDVar8->f + (ulong)(uVar11 & 0xfffffff8));
    table->cache = pDVar10;
    if (((ulong)pDVar10 & 0x1f) != 0) {
      __assert_fail("((ptruint) table->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cudd/cuddCache.c"
                    ,0x3da,"void cuddCacheResize(DdManager *)");
    }
    iVar9 = table->cacheShift + -1;
    table->cacheShift = iVar9;
    table->memused = table->memused + (ulong)uVar2 * 0x28;
    table->cacheSlack = table->cacheSlack + uVar2 * -2;
    if (uVar6 != 0) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pDVar8->h + lVar13 + (ulong)(uVar11 >> 3) * 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar13 = lVar13 + 0x28;
      } while ((ulong)uVar6 * 0x28 != lVar13);
    }
    if (uVar2 == 0) {
      dVar15 = 0.0;
    }
    else {
      lVar13 = 0;
      iVar12 = 0;
      do {
        pDVar4 = *(DdNode **)((long)&pDVar3->data + lVar13);
        if (pDVar4 != (DdNode *)0x0) {
          uVar11 = *(uint *)((long)&pDVar3->hash + lVar13);
          uVar14 = uVar11 >> ((byte)iVar9 & 0x1f);
          pDVar10[(int)uVar14].f = *(DdNode **)((long)&pDVar3->f + lVar13);
          pDVar10[(int)uVar14].g = *(DdNode **)((long)&pDVar3->g + lVar13);
          pDVar10[(int)uVar14].h = *(ptruint *)((long)&pDVar3->h + lVar13);
          pDVar10[(int)uVar14].data = pDVar4;
          pDVar10[(int)uVar14].hash = uVar11;
          iVar12 = iVar12 + 1;
        }
        lVar13 = lVar13 + 0x28;
      } while ((ulong)uVar2 * 0x28 != lVar13);
      dVar15 = (double)iVar12;
    }
    if (__ptr != (DdCache *)0x0) {
      free(__ptr);
    }
    dVar5 = (double)(int)((double)uVar6 * table->minHit + 1.0);
    table->totCacheMisses = (table->cacheMisses - dVar5) + table->totCacheMisses;
    table->cacheMisses = dVar5;
    table->totCachehits = table->cacheHits + table->totCachehits;
    table->cacheHits = 0.0;
    table->cacheLastInserts = table->cacheinserts - dVar15;
  }
  return;
}

Assistant:

void
cuddCacheResize(
  DdManager * table)
{
    DdCache *cache, *oldcache, *oldacache, *entry, *old;
    int i;
    int posn, shift;
    unsigned int slots, oldslots;
    double offset;
    int moved = 0;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;
#ifndef DD_CACHE_PROFILE
    ptruint misalignment;
    DdNodePtr *mem;
#endif

    oldcache = table->cache;
    oldacache = table->acache;
    oldslots = table->cacheSlots;
    slots = table->cacheSlots = oldslots << 1;

#ifdef DD_VERBOSE
    (void) fprintf(table->err,"Resizing the cache from %d to %d entries\n",
                   oldslots, slots);
    (void) fprintf(table->err,
                   "\thits = %g\tmisses = %g\thit ratio = %5.3f\n",
                   table->cacheHits, table->cacheMisses,
                   table->cacheHits / (table->cacheHits + table->cacheMisses));
#endif

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
//    table->acache = cache = ABC_ALLOC(DdCache,slots+1);
    table->acache = cache = ABC_ALLOC(DdCache,slots+2);
    MMoutOfMemory = saveHandler;
    /* If we fail to allocate the new table we just give up. */
    if (cache == NULL) {
#ifdef DD_VERBOSE
        (void) fprintf(table->err,"Resizing failed. Giving up.\n");
#endif
        table->cacheSlots = oldslots;
        table->acache = oldacache;
        /* Do not try to resize again. */
        table->maxCacheHard = oldslots - 1;
        table->cacheSlack = - (int) (oldslots + 1);
        return;
    }
    /* If the size of the cache entry is a power of 2, we want to
    ** enforce alignment to that power of two. This happens when
    ** DD_CACHE_PROFILE is not defined. */
#ifdef DD_CACHE_PROFILE
    table->cache = cache;
#else
    mem = (DdNodePtr *) cache;
//    misalignment = (ptruint) mem & (sizeof(DdCache) - 1);
//    mem += (sizeof(DdCache) - misalignment) / sizeof(DdNodePtr);
//    table->cache = cache = (DdCache *) mem;
//    assert(((ptruint) table->cache & (sizeof(DdCache) - 1)) == 0);
    misalignment = (ptruint) mem & (32 - 1);
    mem += (32 - misalignment) / sizeof(DdNodePtr);
    table->cache = cache = (DdCache *) mem;
    assert(((ptruint) table->cache & (32 - 1)) == 0);
#endif
    shift = --(table->cacheShift);
    table->memused += (slots - oldslots) * sizeof(DdCache);
    table->cacheSlack -= slots; /* need these many slots to double again */

    /* Clear new cache. */
    for (i = 0; (unsigned) i < slots; i++) {
        cache[i].data = NULL;
        cache[i].h = 0;
#ifdef DD_CACHE_PROFILE
        cache[i].count = 0;
#endif
    }

    /* Copy from old cache to new one. */
    for (i = 0; (unsigned) i < oldslots; i++) {
        old = &oldcache[i];
        if (old->data != NULL) {
//            posn = ddCHash2(old->h,old->f,old->g,shift);
            posn = old->hash >> shift;
            entry = &cache[posn];
            entry->f = old->f;
            entry->g = old->g;
            entry->h = old->h;
            entry->data = old->data;
#ifdef DD_CACHE_PROFILE
            entry->count = 1;
#endif
            entry->hash = old->hash;
            moved++;
        }
    }

    ABC_FREE(oldacache);

    /* Reinitialize measurements so as to avoid division by 0 and
    ** immediate resizing.
    */
    offset = (double) (int) (slots * table->minHit + 1);
    table->totCacheMisses += table->cacheMisses - offset;
    table->cacheMisses = offset;
    table->totCachehits += table->cacheHits;
    table->cacheHits = 0;
    table->cacheLastInserts = table->cacheinserts - (double) moved;

}